

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderMaxUniformBlocksTest::clean(GeometryShaderMaxUniformBlocksTest *this)

{
  pointer p_Var1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  ulong uVar5;
  long lVar6;
  long lVar4;
  
  iVar2 = (*((this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x40))(0x8a11,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x5a1);
  if (0 < this->m_max_uniform_blocks) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      (**(code **)(lVar4 + 0x48))(0x8a11,uVar5 & 0xffffffff,0);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glBindBufferBase() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                      ,0x5a8);
      (**(code **)(lVar4 + 0x438))
                (1,(long)&((this->m_uniform_blocks).
                           super__Vector_base<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block,_std::allocator<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block>_>
                           ._M_impl.super__Vector_impl_data._M_start)->buffer_object_id + lVar6);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glDeleteBuffers() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                      ,0x5ac);
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 8;
    } while ((long)uVar5 < (long)this->m_max_uniform_blocks);
  }
  p_Var1 = (this->m_uniform_blocks).
           super__Vector_base<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block,_std::allocator<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_uniform_blocks).
      super__Vector_base<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block,_std::allocator<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block>_>
      ._M_impl.super__Vector_impl_data._M_finish != p_Var1) {
    (this->m_uniform_blocks).
    super__Vector_base<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block,_std::allocator<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block>_>
    ._M_impl.super__Vector_impl_data._M_finish = p_Var1;
  }
  return;
}

Assistant:

void GeometryShaderMaxUniformBlocksTest::clean()
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind default to uniform binding point */
	gl.bindBuffer(GL_UNIFORM_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");

	/* Release buffers */
	for (glw::GLint i = 0; i < m_max_uniform_blocks; ++i)
	{
		/* Bind default to uniform block */
		gl.bindBufferBase(GL_UNIFORM_BUFFER, i, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed");

		/* Delete buffer */
		gl.deleteBuffers(1, &m_uniform_blocks[i].buffer_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers() call failed");
	}

	/* Free memory */
	m_uniform_blocks.clear();
}